

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_mutex.cpp
# Opt level: O2

void __thiscall SharedMutex::~SharedMutex(SharedMutex *this)

{
  __pid_t _Var1;
  int iVar2;
  ContextManager *pCVar3;
  string local_30;
  
  _Var1 = getpid();
  if (_Var1 == this->owner_pid_) {
    iVar2 = pthread_mutex_destroy
                      ((pthread_mutex_t *)
                       ((this->mutex_)._M_t.
                        super___uniq_ptr_impl<SharedMemoryObject<pthread_mutex_t>,_std::default_delete<SharedMemoryObject<pthread_mutex_t>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_SharedMemoryObject<pthread_mutex_t>_*,_std::default_delete<SharedMemoryObject<pthread_mutex_t>_>_>
                        .super__Head_base<0UL,_SharedMemoryObject<pthread_mutex_t>_*,_false>.
                       _M_head_impl)->ptr_);
    if (iVar2 != 0) {
      pCVar3 = ContextManager::get();
      format_abi_cxx11_(&local_30,"Failed to destroy mutex: %m");
      (**pCVar3->_vptr_ContextManager)(pCVar3,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  std::
  unique_ptr<SharedMemoryObject<pthread_mutex_t>,_std::default_delete<SharedMemoryObject<pthread_mutex_t>_>_>
  ::~unique_ptr(&this->mutex_);
  return;
}

Assistant:

SharedMutex::~SharedMutex() {
    if (getpid() == owner_pid_) {
        if (pthread_mutex_destroy(mutex_->get()) != 0) {
            die(format("Failed to destroy mutex: %m"));
        }
    }
}